

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O3

SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_256>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_256>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_256>_>
            *this,CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_256>
                  *_rhs)

{
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false> *pBVar1
  ;
  long lVar2;
  long lVar3;
  PointerType pdVar4;
  Index outerSize;
  double *pdVar5;
  Index col;
  long lVar6;
  
  pBVar1 = this->m_matrix;
  lVar2 = (pBVar1->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_0>
          .m_cols.m_value;
  if (lVar2 == (_rhs->m_rhs).
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value) {
    if (0 < lVar2) {
      lVar3 = (pBVar1->
              super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_Eigen::Dense>
              ).
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_true>
              .m_outerStride;
      pdVar4 = (_rhs->m_rhs).
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data;
      pdVar5 = (pBVar1->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_0>
               .m_data + 1;
      lVar6 = 0;
      do {
        pdVar5[-1] = pdVar5[-1] -
                     (_rhs->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                     m_storage.m_data.array[0] * pdVar4[lVar6];
        *pdVar5 = *pdVar5 - (_rhs->m_lhs).
                            super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                            m_data.array[1] * pdVar4[lVar6];
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + lVar3;
      } while (lVar2 != lVar6);
    }
    return this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 2>, Eigen::CoeffBasedProduct<Eigen::Matrix<double, 2, 1>, const Eigen::Map<Eigen::Matrix<double, 1, -1>>, 256>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_difference_op<double>, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 2>, Rhs = Eigen::CoeffBasedProduct<Eigen::Matrix<double, 2, 1>, const Eigen::Map<Eigen::Matrix<double, 1, -1>>, 256>, RhsDerived = Eigen::CoeffBasedProduct<Eigen::Matrix<double, 2, 1>, const Eigen::Map<Eigen::Matrix<double, 1, -1>>, 256>]"
               );
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }